

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O2

void __thiscall
TEST_MockCallTest_shouldntFailTwice_Test::TEST_MockCallTest_shouldntFailTwice_Test
          (TEST_MockCallTest_shouldntFailTwice_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMockCallTest).super_Utest._vptr_Utest = (_func_int **)0x0;
  TEST_GROUP_CppUTestGroupMockCallTest::TEST_GROUP_CppUTestGroupMockCallTest
            (&this->super_TEST_GROUP_CppUTestGroupMockCallTest);
  (this->super_TEST_GROUP_CppUTestGroupMockCallTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_002dec48;
  return;
}

Assistant:

TEST(MockCallTest, shouldntFailTwice)
{
  MockFailureReporterInstaller failureReporterInstaller;

  mock().strictOrder();
  mock().expectOneCall("foo");
  mock().expectOneCall("boo");
  mock().actualCall("boo");
  mock().actualCall("bar");
  mock().checkExpectations();

  CHECK(!MockFailureReporterForTest::getReporter()->mockFailureString.contains("bar"));
  CHECK(MockFailureReporterForTest::getReporter()->mockFailureString.contains("boo"));
}